

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::FunctionValidator::validateMemBytes
          (FunctionValidator *this,uint8_t bytes,Type type,Expression *curr)

{
  BasicType BVar1;
  bool local_3a;
  bool local_39;
  Expression *curr_local;
  uint8_t bytes_local;
  FunctionValidator *this_local;
  Type type_local;
  
  this_local = (FunctionValidator *)type.id;
  BVar1 = wasm::Type::getBasic((Type *)&this_local);
  switch(BVar1) {
  case none:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                       ,0x5fe);
  case unreachable:
    break;
  case i32:
    local_39 = true;
    if ((bytes != '\x01') && (local_39 = true, bytes != '\x02')) {
      local_39 = bytes == '\x04';
    }
    shouldBeTrue<wasm::Expression*>
              (this,local_39,curr,"expected i32 operation to touch 1, 2, or 4 bytes");
    break;
  case i64:
    local_3a = true;
    if (((bytes != '\x01') && (local_3a = true, bytes != '\x02')) &&
       (local_3a = true, bytes != '\x04')) {
      local_3a = bytes == '\b';
    }
    shouldBeTrue<wasm::Expression*>
              (this,local_3a,curr,"expected i64 operation to touch 1, 2, 4, or 8 bytes");
    break;
  case f32:
    shouldBeEqual<wasm::Expression*,unsigned_char>
              (this,bytes,'\x04',curr,"expected f32 operation to touch 4 bytes");
    break;
  case f64:
    shouldBeEqual<wasm::Expression*,unsigned_char>
              (this,bytes,'\b',curr,"expected f64 operation to touch 8 bytes");
    break;
  case v128:
    shouldBeEqual<wasm::Expression*,unsigned_char>
              (this,bytes,'\x10',curr,"expected v128 operation to touch 16 bytes");
  }
  return;
}

Assistant:

void FunctionValidator::validateMemBytes(uint8_t bytes,
                                         Type type,
                                         Expression* curr) {
  switch (type.getBasic()) {
    case Type::i32:
      shouldBeTrue(bytes == 1 || bytes == 2 || bytes == 4,
                   curr,
                   "expected i32 operation to touch 1, 2, or 4 bytes");
      break;
    case Type::i64:
      shouldBeTrue(bytes == 1 || bytes == 2 || bytes == 4 || bytes == 8,
                   curr,
                   "expected i64 operation to touch 1, 2, 4, or 8 bytes");
      break;
    case Type::f32:
      shouldBeEqual(
        bytes, uint8_t(4), curr, "expected f32 operation to touch 4 bytes");
      break;
    case Type::f64:
      shouldBeEqual(
        bytes, uint8_t(8), curr, "expected f64 operation to touch 8 bytes");
      break;
    case Type::v128:
      shouldBeEqual(
        bytes, uint8_t(16), curr, "expected v128 operation to touch 16 bytes");
      break;
    case Type::unreachable:
      break;
    case Type::none:
      WASM_UNREACHABLE("unexpected type");
  }
}